

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_client.cpp
# Opt level: O0

int ep_connect_and_loop(char *host,int port,void *userdata)

{
  int __fd;
  int iVar1;
  int len_00;
  char *pcVar2;
  ssize_t sVar3;
  int *piVar4;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  int len;
  int fd;
  char buf [512];
  int local_e0;
  int i;
  int cnt;
  epoll_event events [10];
  epoll_event event;
  sockaddr_in *psa;
  sockaddr_in sa;
  int sk;
  int efd;
  in_port_t i16_port;
  int ret;
  void *userdata_local;
  int port_local;
  char *host_local;
  
  if ((uint16_t)port == 0) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_300 = 
        "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
        ;
      }
      else {
        local_300 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                            ,0x5c);
        local_300 = local_300 + 1;
      }
      local_2f8 = local_300;
    }
    else {
      local_2f8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                          ,0x2f);
      local_2f8 = local_2f8 + 1;
    }
    printf("\x1b[31mERROR: %s: %s: %d: port number is wrong:%d\x1b[m\n",local_2f8,
           "ep_connect_and_loop",0x26,0);
    sk_on_global_error();
  }
  else {
    sa.sin_zero._4_4_ = epoll_create(10);
    if (sa.sin_zero._4_4_ == -1) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                         ,0x5c);
        if (pcVar2 == (char *)0x0) {
          local_310 = 
          "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
          ;
        }
        else {
          local_310 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                              ,0x5c);
          local_310 = local_310 + 1;
        }
        local_308 = local_310;
      }
      else {
        local_308 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                            ,0x2f);
        local_308 = local_308 + 1;
      }
      printf("\x1b[31mERROR: %s: %s: %d: epoll_create error!\x1b[m\n",local_308,
             "ep_connect_and_loop",0x2f);
      sk_on_global_error();
    }
    else {
      sk_on_start(sa.sin_zero._4_4_,userdata);
      sa.sin_zero._0_4_ = socket(2,1,6);
      if (sa.sin_zero._0_4_ == -1) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                           ,0x5c);
          if (pcVar2 == (char *)0x0) {
            local_320 = 
            "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
            ;
          }
          else {
            local_320 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                ,0x5c);
            local_320 = local_320 + 1;
          }
          local_318 = local_320;
        }
        else {
          local_318 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                              ,0x2f);
          local_318 = local_318 + 1;
        }
        printf("\x1b[31mERROR: %s: %s: %d: open socket failed!\x1b[m\n",local_318,
               "ep_connect_and_loop",0x39);
        sk_on_global_error();
      }
      else {
        memset(&psa,0,0x10);
        psa._0_2_ = 2;
        psa._2_2_ = htons((uint16_t)port);
        iVar1 = inet_pton(2,host,(void *)((long)&psa + 4));
        if (iVar1 == 0) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                             ,0x5c);
            if (pcVar2 == (char *)0x0) {
              local_330 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
              ;
            }
            else {
              local_330 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                  ,0x5c);
              local_330 = local_330 + 1;
            }
            local_328 = local_330;
          }
          else {
            local_328 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                ,0x2f);
            local_328 = local_328 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: inet_pton failed, invalid address!\x1b[m\n",local_328,
                 "ep_connect_and_loop",0x47);
          close(sa.sin_zero._0_4_);
        }
        else if (iVar1 < 0) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                             ,0x5c);
            if (pcVar2 == (char *)0x0) {
              local_340 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
              ;
            }
            else {
              local_340 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                  ,0x5c);
              local_340 = local_340 + 1;
            }
            local_338 = local_340;
          }
          else {
            local_338 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                ,0x2f);
            local_338 = local_338 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: inet_pton failed\x1b[m\n",local_338,
                 "ep_connect_and_loop",0x4d);
          close(sa.sin_zero._0_4_);
          sk_on_global_error();
        }
        else {
          iVar1 = connect(sa.sin_zero._0_4_,(sockaddr *)&psa,0x10);
          if (-1 < iVar1) {
            sk_on_connected(sa.sin_zero._4_4_,sa.sin_zero._0_4_);
            set_non_block(sa.sin_zero._0_4_);
            events[9].data.u64._4_4_ = 0x80000005;
            epoll_ctl(sa.sin_zero._4_4_,1,sa.sin_zero._0_4_,
                      (epoll_event *)((long)&events[9].data + 4));
            do {
              iVar1 = epoll_wait(sa.sin_zero._4_4_,(epoll_event *)&i,10,-1);
              for (local_e0 = 0; local_e0 < iVar1; local_e0 = local_e0 + 1) {
                if (((&i)[(long)local_e0 * 3] & 1U) != 0) {
                  __fd = *(int *)((long)&events[(long)local_e0 + -1].data + 4);
                  sVar3 = read(__fd,&len,0x200);
                  len_00 = (int)sVar3;
                  if (len_00 == -1) {
                    piVar4 = __errno_location();
                    if (*piVar4 == 0xb) break;
                    sk_on_read_error(sa.sin_zero._4_4_,__fd);
                  }
                  else if (len_00 == 0) {
                    close(*(int *)((long)&events[(long)local_e0 + -1].data + 4));
                    sk_on_disconnected(sa.sin_zero._4_4_,__fd);
                    break;
                  }
                  sk_on_read_data(sa.sin_zero._4_4_,__fd,(byte *)&len,len_00);
                }
              }
            } while( true );
          }
          pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                             ,0x5c);
            if (pcVar2 == (char *)0x0) {
              local_350 = 
              "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
              ;
            }
            else {
              local_350 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                  ,0x5c);
              local_350 = local_350 + 1;
            }
            local_348 = local_350;
          }
          else {
            local_348 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/epoll/epoll_client.cpp"
                                ,0x2f);
            local_348 = local_348 + 1;
          }
          printf("\x1b[31mERROR: %s: %s: %d: connect failed\x1b[m\n",local_348,"ep_connect_and_loop"
                 ,0x55);
          close(sa.sin_zero._0_4_);
          sk_on_global_error();
        }
      }
    }
  }
  return -1;
}

Assistant:

int ep_connect_and_loop(const char *host, int port, void *userdata)
{
    int ret = RET_OK;

    in_port_t i16_port = port;
    if(0 >= i16_port)
    {
        LOGE("port number is wrong:%d", i16_port);
        sk_on_global_error();
        return RET_ERR;
    }

    int efd;
    efd = epoll_create(10);
    if(efd == -1)
    {
        LOGE("epoll_create error!");
        sk_on_global_error();
        return RET_ERR;
    }

    sk_on_start(efd, userdata);

    int sk = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(-1 == sk)
    {
        LOGE("open socket failed!");
        sk_on_global_error();
        return RET_ERR;
    }

    struct sockaddr_in sa = {0};
    sa.sin_family = AF_INET;
    sa.sin_port = htons(i16_port);

    struct sockaddr_in *psa = &sa;

    ret = inet_pton(AF_INET, host, &psa->sin_addr.s_addr);
    if(0 == ret)
    {
        LOGE("inet_pton failed, invalid address!");
        close(sk);
        return RET_ERR;
    }
    else if(ret < 0)
    {
        LOGE("inet_pton failed");
        close(sk);
        sk_on_global_error();
        return RET_ERR;
    }

    if(connect(sk, (struct sockaddr*)&sa, sizeof(sa)) < 0)
    {
        LOGE("connect failed");
        close(sk);
        sk_on_global_error();
        return RET_ERR;
    } else {
        sk_on_connected(efd, sk);
    }

    set_non_block(sk);

    struct epoll_event event;
    struct epoll_event events[10];

    event.events = EPOLLOUT | EPOLLIN | EPOLLET;
    event.data.fd = sk;

    epoll_ctl(efd, EPOLL_CTL_ADD, sk, &event);

    while(1)
    {
        int cnt = epoll_wait(efd, events, 10, -1);
        for (int i = 0; i < cnt; i++)
        {
            if(events[i].events & EPOLLIN)
            {
                char buf[BUF_SIZE];
                int fd = events[i].data.fd;
                int len = read(fd, buf, BUF_SIZE);
                if (len == -1) {
                    if (errno == EAGAIN) {
                        break;
                    }

                    sk_on_read_error(efd, fd);

                } else if (len == 0) {
                    close(events[i].data.fd);
                    sk_on_disconnected(efd, fd);
                    break;
                }

                sk_on_read_data(efd, fd, (byte*)buf, len);
            }
        }
    }

    close(sk);
    close(efd);

    return RET_OK;
}